

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::ByteSizeLong
          (SoundAnalysisPreprocessing *this)

{
  size_t sVar1;
  
  if (this->_oneof_case_[0] == 0x14) {
    ((this->SoundAnalysisPreprocessingType_).vggish_)->_cached_size_ = 0;
    sVar1 = 3;
  }
  else {
    sVar1 = 0;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t SoundAnalysisPreprocessing::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  size_t total_size = 0;

  switch (SoundAnalysisPreprocessingType_case()) {
    // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
    case kVggish: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SoundAnalysisPreprocessingType_.vggish_);
      break;
    }
    case SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}